

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControllerWidget::paintEvent(ControllerWidget *this,QPaintEvent *param_1)

{
  QFlagsStorageHelper<QStyle::SubControl,_4> QVar1;
  long lVar2;
  QFlagsStorage<QStyle::SubControl> QVar3;
  QStyle *pQVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QPainter painter;
  QStyleOptionComplex opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex(&opt,1,0xf0000);
  initStyleOption(this,&opt);
  QVar1.super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorage<QStyle::SubControl>)this->activeControl;
  QVar3.i = this->hoverControl;
  if (QVar1.super_QFlagsStorage<QStyle::SubControl>.i == (QFlagsStorage<QStyle::SubControl>)QVar3.i)
  {
    uVar5 = 4;
    QVar3.i = (Int)QVar1.super_QFlagsStorage<QStyle::SubControl>.i;
  }
  else {
    uVar5 = 0x2000;
    if (QVar1.super_QFlagsStorage<QStyle::SubControl>.i != 0 || QVar3.i == SC_None)
    goto LAB_004156be;
  }
  opt.activeSubControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)
       (QFlagsStorageHelper<QStyle::SubControl,_4>)QVar3.i;
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       ((uint)opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i | uVar5);
LAB_004156be:
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter,&(this->super_QWidget).super_QPaintDevice);
  pQVar4 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar4 + 200))(pQVar4,8,&opt,&painter,this);
  QPainter::~QPainter(&painter);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::paintEvent(QPaintEvent * /*paintEvent*/)
{
    QStyleOptionComplex opt;
    initStyleOption(&opt);
    if (activeControl == hoverControl) {
        opt.activeSubControls = activeControl;
        opt.state |= QStyle::State_Sunken;
    } else if (hoverControl != QStyle::SC_None && (activeControl == QStyle::SC_None)) {
        opt.activeSubControls = hoverControl;
        opt.state |= QStyle::State_MouseOver;
    }
    QPainter painter(this);
    style()->drawComplexControl(QStyle::CC_MdiControls, &opt, &painter, this);
}